

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O2

void __thiscall gss::innards::SVOBitset::SVOBitset(SVOBitset *this,SVOBitset *other)

{
  uint uVar1;
  BitWord BVar2;
  BitWord BVar3;
  BitWord BVar4;
  BitWord BVar5;
  BitWord BVar6;
  BitWord BVar7;
  BitWord BVar8;
  BitWord BVar9;
  BitWord BVar10;
  BitWord BVar11;
  BitWord BVar12;
  BitWord BVar13;
  BitWord BVar14;
  BitWord BVar15;
  BitWord BVar16;
  BitWord *__dest;
  
  uVar1 = other->n_words;
  this->n_words = uVar1;
  if ((ulong)uVar1 < 0x11) {
    BVar2 = (other->_data).short_data[0];
    BVar3 = (other->_data).short_data[1];
    BVar4 = (other->_data).short_data[2];
    BVar5 = (other->_data).short_data[3];
    BVar6 = (other->_data).short_data[4];
    BVar7 = (other->_data).short_data[5];
    BVar8 = (other->_data).short_data[6];
    BVar9 = (other->_data).short_data[7];
    BVar10 = (other->_data).short_data[9];
    BVar11 = (other->_data).short_data[10];
    BVar12 = (other->_data).short_data[0xb];
    BVar13 = (other->_data).short_data[0xc];
    BVar14 = (other->_data).short_data[0xd];
    BVar15 = (other->_data).short_data[0xe];
    BVar16 = (other->_data).short_data[0xf];
    (this->_data).short_data[8] = (other->_data).short_data[8];
    (this->_data).short_data[9] = BVar10;
    (this->_data).short_data[10] = BVar11;
    (this->_data).short_data[0xb] = BVar12;
    (this->_data).short_data[0xc] = BVar13;
    (this->_data).short_data[0xd] = BVar14;
    (this->_data).short_data[0xe] = BVar15;
    (this->_data).short_data[0xf] = BVar16;
    (this->_data).short_data[0] = BVar2;
    (this->_data).short_data[1] = BVar3;
    (this->_data).short_data[2] = BVar4;
    (this->_data).short_data[3] = BVar5;
    (this->_data).short_data[4] = BVar6;
    (this->_data).short_data[5] = BVar7;
    (this->_data).short_data[6] = BVar8;
    (this->_data).short_data[7] = BVar9;
  }
  else {
    __dest = (BitWord *)operator_new__((ulong)uVar1 << 3);
    (this->_data).long_data = __dest;
    if ((ulong)other->n_words != 0) {
      memmove(__dest,(other->_data).long_data,(ulong)other->n_words << 3);
      return;
    }
  }
  return;
}

Assistant:

SVOBitset(const SVOBitset & other)
        {
            if (other._is_long()) {
                n_words = other.n_words;
                _data.long_data = new BitWord[n_words];
                std::copy(other._data.long_data, other._data.long_data + other.n_words, _data.long_data);
            }
            else {
                n_words = other.n_words;
                std::copy(&other._data.short_data[0], &other._data.short_data[svo_size], &_data.short_data[0]);
            }
        }